

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseOffsetOpt(WastParser *this,Address *out_offset)

{
  Location loc;
  bool bVar1;
  Result RVar2;
  char *s;
  undefined8 in_R8;
  undefined8 in_R9;
  string_view sVar3;
  uint64_t offset64;
  Token token;
  
  bVar1 = PeekMatch(this,OffsetEqNat);
  if (bVar1) {
    Consume(&token,this);
    sVar3 = Token::text(&token);
    s = sVar3.data_;
    RVar2 = ParseInt64(s,s + sVar3.size_,&offset64,SignedAndUnsigned);
    if (RVar2.enum_ == Error) {
      loc.filename.data_._4_4_ = token.loc.filename.data_._4_4_;
      loc.filename.data_._0_4_ = token.loc.filename.data_._0_4_;
      loc.filename.size_._0_4_ = (undefined4)token.loc.filename.size_;
      loc.filename.size_._4_4_ = token.loc.filename.size_._4_4_;
      loc.field_1.field_0.line = token.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = token.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = token.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = token.loc.field_1._12_4_;
      Error(this,loc,"invalid offset \"%.*s\"",sVar3.size_ & 0xffffffff,s,in_R8,in_R9);
    }
    if (offset64 >> 0x20 != 0) {
      Error(this,0x294af6);
    }
    *out_offset = offset64;
  }
  else {
    *out_offset = 0;
  }
  return bVar1;
}

Assistant:

bool WastParser::ParseOffsetOpt(Address* out_offset) {
  WABT_TRACE(ParseOffsetOpt);
  if (PeekMatch(TokenType::OffsetEqNat)) {
    Token token = Consume();
    uint64_t offset64;
    string_view sv = token.text();
    if (Failed(ParseInt64(sv.begin(), sv.end(), &offset64,
                          ParseIntType::SignedAndUnsigned))) {
      Error(token.loc, "invalid offset \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }
    // FIXME: make this depend on the current memory.
    if (offset64 > UINT32_MAX) {
      Error(token.loc, "offset must be less than or equal to 0xffffffff");
    }
    *out_offset = offset64;
    return true;
  } else {
    *out_offset = 0;
    return false;
  }
}